

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread_POSIX.c
# Opt level: O3

UINT8 OSThread_Init(OS_THREAD **retThread,OS_THR_FUNC threadFunc,void *args)

{
  UINT8 UVar1;
  int iVar2;
  OS_THREAD *__newthread;
  
  __newthread = (OS_THREAD *)calloc(1,0x18);
  if (__newthread == (OS_THREAD *)0x0) {
    UVar1 = 0xff;
  }
  else {
    __newthread->func = threadFunc;
    __newthread->args = args;
    iVar2 = pthread_create((pthread_t *)__newthread,(pthread_attr_t *)0x0,OSThread_Main,__newthread)
    ;
    if (iVar2 == 0) {
      *retThread = __newthread;
      UVar1 = '\0';
    }
    else {
      free(__newthread);
      UVar1 = 0x80;
    }
  }
  return UVar1;
}

Assistant:

UINT8 OSThread_Init(OS_THREAD** retThread, OS_THR_FUNC threadFunc, void* args)
{
	OS_THREAD* thr;
	int retVal;
	
	thr = (OS_THREAD*)calloc(1, sizeof(OS_THREAD));
	if (thr == NULL)
		return 0xFF;
	
	thr->func = threadFunc;
	thr->args = args;
	
	retVal = pthread_create(&thr->id, NULL, &OSThread_Main, thr);
	if (retVal)
	{
		free(thr);
		return 0x80;
	}
	
	*retThread = thr;
	return 0x00;
}